

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O2

shared_array<int> * __thiscall
FIX::shared_array<int>::operator=(shared_array<int> *this,shared_array<int> *rhs)

{
  long *plVar1;
  atomic<long> *counter;
  
  if (rhs != this) {
    plVar1 = (long *)rhs->m_buffer;
    if (plVar1 != (long *)0x0) {
      LOCK();
      *plVar1 = *plVar1 + 1;
      UNLOCK();
    }
    release(this);
    this->m_size = rhs->m_size;
    this->m_buffer = rhs->m_buffer;
  }
  return this;
}

Assistant:

shared_array &operator=(const shared_array &rhs) {
    if (&rhs == this) {
      return *this;
    }

    rhs.attach();
    release();

    m_size = rhs.m_size;
    m_buffer = rhs.m_buffer;

    return *this;
  }